

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_pshufh_mips64(uint64_t fs,uint64_t ft)

{
  long lVar1;
  LMIValue vd;
  LMIValue vs;
  
  vs.d = fs;
  vd.d = 0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(undefined2 *)((long)&vd + lVar1 * 2) = *(undefined2 *)((long)&vs + (ulong)((uint)ft & 3) * 2);
    ft = ft >> 2;
  }
  return vd.d;
}

Assistant:

uint64_t helper_pshufh(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(3);
    LMIValue vd, vs;
    unsigned i;

    vs.d = fs;
    vd.d = 0;
    for (i = 0; i < 4; i++, ft >>= 2) {
        vd.uh[i ^ host] = vs.uh[(ft & 3) ^ host];
    }
    return vd.d;
}